

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O0

int CVBBDPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                  void *bbd_data)

{
  CVodeMem cv_mem_00;
  int iVar1;
  undefined4 *in_RCX;
  int in_EDX;
  SUNMatrix in_R8;
  SUNLinearSolver in_XMM1_Qa;
  int retval;
  CVodeMem cv_mem;
  CVBBDPrecData pdata;
  N_Vector in_stack_00000080;
  N_Vector in_stack_00000088;
  N_Vector in_stack_00000090;
  N_Vector in_stack_00000098;
  sunrealtype in_stack_000000a0;
  undefined4 in_stack_000000a8;
  undefined4 in_stack_000000ac;
  SUNMatrix p_Var2;
  int local_4;
  
  cv_mem_00 = (CVodeMem)in_R8[6].ops;
  p_Var2 = in_R8;
  if (in_EDX == 0) {
    *in_RCX = 1;
    iVar1 = SUNMatZero(in_R8[2].ops);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x1f7,"CVBBDPrecSetup",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                     ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
    iVar1 = CVBBDDQJac((CVBBDPrecData)CONCAT44(in_stack_000000ac,in_stack_000000a8),
                       in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                       in_stack_00000080);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x200,"CVBBDPrecSetup",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                     ,"The gloc or cfn routine failed in an unrecoverable manner.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
    iVar1 = SUNMatCopy(in_R8[2].ops,in_R8[2].sunctx);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x209,"CVBBDPrecSetup",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                     ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
  }
  else {
    *in_RCX = 0;
    iVar1 = SUNMatCopy(in_R8[2].ops,in_R8[2].sunctx);
    if (iVar1 < 0) {
      cvProcessError(cv_mem_00,-1,0x1e9,"CVBBDPrecSetup",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                     ,"An error arose from a SUNBandMatrix routine.");
      return -1;
    }
    if (0 < iVar1) {
      return 1;
    }
  }
  iVar1 = SUNMatScaleAddI((ulong)in_XMM1_Qa ^ 0x8000000000000000,in_R8[2].sunctx);
  if (iVar1 == 0) {
    local_4 = SUNLinSolSetup_Band(in_XMM1_Qa,p_Var2);
  }
  else {
    cvProcessError(cv_mem_00,-1,0x214,"CVBBDPrecSetup",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bbdpre.c"
                   ,"An error arose from a SUNBandMatrix routine.");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int CVBBDPrecSetup(sunrealtype t, N_Vector y,
                          SUNDIALS_MAYBE_UNUSED N_Vector fy, sunbooleantype jok,
                          sunbooleantype* jcurPtr, sunrealtype gamma,
                          void* bbd_data)
{
  CVBBDPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  pdata  = (CVBBDPrecData)bbd_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  /* If jok = SUNTRUE, use saved copy of J */
  if (jok)
  {
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    /* Otherwise call CVBBDDQJac for new J value */
  }
  else
  {
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBBDDQJac(pdata, t, y, pdata->tmp1, pdata->tmp2, pdata->tmp3);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_FUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBBD_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add I to get P = I - gamma*J */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}